

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O0

void arangodb::velocypack::HexDump::appendHex(string *result,uint8_t value)

{
  byte bVar1;
  int iVar2;
  byte in_SIL;
  undefined8 in_RDI;
  uint8_t x;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = in_SIL / 0x10;
  if (bVar1 < 10) {
    iVar2 = bVar1 + 0x30;
  }
  else {
    iVar2 = bVar1 + 0x57;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffffe0),
             (char)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffffe0),(char)((ulong)in_RDI >> 0x38));
  return;
}

Assistant:

void HexDump::appendHex(std::string& result, uint8_t value) {
  uint8_t x = value / 16;
  result.push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
  x = value % 16;
  result.push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
}